

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

uint obmc_check_better(MACROBLOCKD *xd,AV1_COMMON *cm,MV *this_mv,MV *best_mv,
                      SubpelMvLimits *mv_limits,SUBPEL_SEARCH_VAR_PARAMS *var_params,
                      MV_COST_PARAMS *mv_cost_params,uint *besterr,uint *sse1,int *distortion,
                      int *has_better_mv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  uint sse;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  iVar1 = av1_is_subpelmv_in_range(mv_limits,*this_mv);
  if (iVar1 == 0) {
    uVar3 = 0x7fffffff;
  }
  else {
    iVar1 = upsampled_obmc_pref_error(xd,cm,this_mv,var_params,&local_34);
    iVar2 = mv_err_cost_(this_mv,mv_cost_params);
    uVar3 = iVar2 + iVar1;
    if (uVar3 < *besterr) {
      *besterr = uVar3;
      *best_mv = *this_mv;
      *distortion = iVar1;
      *sse1 = local_34;
      *(byte *)has_better_mv = (byte)*has_better_mv | 1;
    }
  }
  return uVar3;
}

Assistant:

static inline unsigned int obmc_check_better(
    MACROBLOCKD *xd, const AV1_COMMON *cm, const MV *this_mv, MV *best_mv,
    const SubpelMvLimits *mv_limits, const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *besterr,
    unsigned int *sse1, int *distortion, int *has_better_mv) {
  unsigned int cost;
  if (av1_is_subpelmv_in_range(mv_limits, *this_mv)) {
    unsigned int sse;
    const int thismse =
        upsampled_obmc_pref_error(xd, cm, this_mv, var_params, &sse);
    cost = mv_err_cost_(this_mv, mv_cost_params);

    cost += thismse;

    if (cost < *besterr) {
      *besterr = cost;
      *best_mv = *this_mv;
      *distortion = thismse;
      *sse1 = sse;
      *has_better_mv |= 1;
    }
  } else {
    cost = INT_MAX;
  }
  return cost;
}